

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# final_contours_extract_features.cpp
# Opt level: O1

void thresh_callback(int param_1,void *param_2)

{
  double dVar1;
  double dVar2;
  Size SVar3;
  pointer pMVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  _InputArray *p_Var8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  char str2 [5];
  Scalar color;
  char str1 [7];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boundRect;
  vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> hierarchy;
  vector<float,_std::allocator<float>_> radius;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours_poly;
  vector<cv::Moments,_std::allocator<cv::Moments>_> mu;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center_contours;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> center;
  Mat drawing;
  vector<cv::Mat,_std::allocator<cv::Mat>_> contourRegion;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  Mat overlap;
  Mat area;
  Mat cropped;
  Mat area1;
  Mat threshold_output;
  uint local_54c;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_548;
  char local_530 [8];
  _OutputArray local_528;
  _InputArray local_508;
  undefined8 uStack_4f0;
  char local_4e8 [8];
  undefined1 local_4e0 [8];
  undefined8 local_4d8;
  undefined1 auStack_4d0 [8];
  Size SStack_4c8;
  uchar *local_4c0;
  uchar *puStack_4b8;
  MatAllocator *local_4b0;
  UMatData *pUStack_4a8;
  MatSize local_4a0;
  UMatData *local_498;
  MatSize local_490;
  size_t *psStack_488;
  Mat local_470;
  Mat local_410;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> local_380;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  void *local_358;
  undefined8 uStack_350;
  long local_348;
  vector<float,_std::allocator<float>_> local_340;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_328;
  vector<cv::Moments,_std::allocator<cv::Moments>_> local_310;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_2f8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_2e0;
  undefined1 local_2c8 [16];
  Size local_2b8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_268;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_248;
  undefined1 local_230 [12];
  int iStack_224;
  Size SStack_220;
  undefined1 local_1d0 [16];
  Size SStack_1c0;
  size_t *local_188;
  ulong local_170;
  ulong local_168 [2];
  undefined1 local_158 [8];
  void *pvStack_150;
  Size local_148;
  undefined1 local_f0 [16];
  Size SStack_e0;
  size_t *local_a8;
  Mat local_90;
  
  cv::Mat::Mat(&local_90);
  local_548.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_548.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_548.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348 = 0;
  local_358 = (void *)0x0;
  uStack_350 = 0;
  local_268.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_4d0._0_4_ = 0;
  auStack_4d0._4_4_ = 0;
  local_4e0._0_4_ = 0x1010000;
  local_4d8 = &src_gray;
  local_1d0._8_8_ = local_2c8;
  local_2c8._0_4_ = 0;
  local_2c8._4_4_ = 0x40240000;
  local_1d0._0_4_ = -0x3efdfffa;
  SStack_1c0.width = 1;
  SStack_1c0.height = 1;
  pvStack_150 = local_230;
  local_230._0_4_ = 0;
  local_230._4_4_ = 0x40590000;
  local_158._0_4_ = -0x3efdfffa;
  local_148.width = 1;
  local_148.height = 1;
  SStack_e0.width = 0;
  SStack_e0.height = 0;
  local_f0._0_4_ = 0x2010000;
  local_f0._8_8_ = &local_90;
  cv::inRange((_InputArray *)local_4e0,(_InputArray *)local_1d0,(_InputArray *)local_158,
              (_OutputArray *)local_f0);
  local_4e0 = (undefined1  [8])auStack_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"thresh","");
  SStack_1c0.width = 0;
  SStack_1c0.height = 0;
  local_1d0._0_4_ = 0x1010000;
  local_1d0._8_8_ = &local_90;
  cv::imshow((string *)local_4e0,(_InputArray *)local_1d0);
  if (local_4e0 != (undefined1  [8])auStack_4d0) {
    operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
  }
  local_4e0 = (undefined1  [8])auStack_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"middle.jpg","");
  SStack_1c0.width = 0;
  SStack_1c0.height = 0;
  local_1d0._0_4_ = 0x1010000;
  local_148.width = 0;
  local_148.height = 0;
  local_158 = (undefined1  [8])0x0;
  pvStack_150 = (void *)0x0;
  local_1d0._8_8_ = &local_90;
  cv::imwrite((string *)local_4e0,(_InputArray *)local_1d0,(vector *)local_158);
  if (local_158 != (undefined1  [8])0x0) {
    operator_delete((void *)local_158,(long)local_148 - (long)local_158);
  }
  if (local_4e0 != (undefined1  [8])auStack_4d0) {
    operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
  }
  auStack_4d0._0_4_ = 0;
  auStack_4d0._4_4_ = 0;
  local_4e0._0_4_ = 0x1010000;
  SStack_1c0.width = 0;
  SStack_1c0.height = 0;
  local_1d0._0_4_ = -0x7dfbfff4;
  local_1d0._8_8_ = &local_548;
  local_148.width = 0;
  local_148.height = 0;
  local_158._0_4_ = -0x7dfcffe4;
  pvStack_150 = &local_358;
  local_168[1] = 0;
  local_4d8 = &local_90;
  cv::findContours();
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector(&local_328,
           ((long)local_548.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_548.
                  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)local_4e0);
  std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
            (&local_380,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_4e0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&local_2e0,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_4e0);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
            (&local_2f8,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_4e0);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_340,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_4e0);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            (&local_248,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_4e0);
  std::vector<cv::Moments,_std::allocator<cv::Moments>_>::vector
            (&local_310,
             ((long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)local_4e0);
  cv::Mat::zeros((int)local_4e0,
                 (int)((ulong)((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_548.
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,2
                );
  cv::Mat::Mat((Mat *)local_1d0);
  (**(code **)(*(long *)local_4e0 + 0x18))(local_4e0,local_4e0,(Mat *)local_1d0,0xffffffff);
  cv::Mat::~Mat(&local_410);
  cv::Mat::~Mat(&local_470);
  cv::Mat::~Mat((Mat *)auStack_4d0);
  cv::Mat::Mat((Mat *)local_158);
  cv::Mat::zeros((int)local_4e0,
                 (int)((ulong)((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_548.
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555,2
                );
  cv::Mat::Mat((Mat *)local_f0);
  (**(code **)(*(long *)local_4e0 + 0x18))(local_4e0,local_4e0,(Mat *)local_f0,0xffffffff);
  cv::Mat::~Mat(&local_410);
  cv::Mat::~Mat(&local_470);
  cv::Mat::~Mat((Mat *)auStack_4d0);
  if ((thresh_callback(int,void*)::oss_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&thresh_callback(int,void*)::oss_abi_cxx11_), iVar5 != 0)) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&thresh_callback(int,void*)::oss_abi_cxx11_);
    __cxa_atexit(std::__cxx11::stringstream::~stringstream,
                 &thresh_callback(int,void*)::oss_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&thresh_callback(int,void*)::oss_abi_cxx11_);
  }
  builtin_strncpy(local_4e8,"result",7);
  builtin_strncpy(local_530,".jpg",5);
  if (local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      local_4e0._0_4_ = 0x42ff400c;
      local_4e0._4_4_ = 2;
      uVar9 = (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_548.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_4d8 = (Mat *)CONCAT44(1,(int)(uVar9 >> 3));
      local_4b0 = (MatAllocator *)0x0;
      pUStack_4a8 = (UMatData *)0x0;
      puStack_4b8 = (uchar *)0x0;
      SStack_4c8.width = 0;
      SStack_4c8.height = 0;
      local_498 = (UMatData *)&local_490;
      local_490.p = (int *)0x0;
      psStack_488 = (size_t *)0x0;
      SVar3 = *(Size *)(local_548.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar11);
      if (SVar3 != (Size)local_548.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        psStack_488 = (size_t *)0x8;
        local_490.p = (int *)0x8;
        puStack_4b8 = (uchar *)(((long)(uVar9 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                               (long)SVar3);
        SStack_4c8 = SVar3;
      }
      local_2b8.width = 0;
      local_2b8.height = 0;
      local_2c8._0_4_ = 0x1010000;
      register0x00000000 =
           local_328.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar11;
      SStack_220.width = 0;
      SStack_220.height = 0;
      local_230._0_4_ = -0x7dfcfff4;
      auStack_4d0 = (undefined1  [8])SStack_4c8;
      local_4c0 = puStack_4b8;
      local_4a0.p = (int *)&local_4d8;
      local_2c8._8_8_ = (Mat *)local_4e0;
      cv::approxPolyDP((_InputArray *)local_2c8,(_OutputArray *)local_230,3.0,true);
      cv::Mat::~Mat((Mat *)local_4e0);
      local_4e0._0_4_ = 0x42ff400c;
      local_4e0._4_4_ = 2;
      uVar9 = (long)local_328.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_328.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_4d8 = (Mat *)CONCAT44(1,(int)(uVar9 >> 3));
      local_4b0 = (MatAllocator *)0x0;
      pUStack_4a8 = (UMatData *)0x0;
      puStack_4b8 = (uchar *)0x0;
      SStack_4c8.width = 0;
      SStack_4c8.height = 0;
      local_498 = (UMatData *)&local_490;
      local_490.p = (int *)0x0;
      psStack_488 = (size_t *)0x0;
      SVar3 = *(Size *)(local_328.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar11);
      if (SVar3 != (Size)local_328.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        psStack_488 = (size_t *)0x8;
        local_490.p = (int *)0x8;
        puStack_4b8 = (uchar *)(((long)(uVar9 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                               (long)SVar3);
        SStack_4c8 = SVar3;
      }
      local_2b8.width = 0;
      local_2b8.height = 0;
      local_2c8._0_4_ = 0x1010000;
      auStack_4d0 = (undefined1  [8])SStack_4c8;
      local_4c0 = puStack_4b8;
      local_4a0.p = (int *)&local_4d8;
      local_2c8._8_8_ = (Mat *)local_4e0;
      cv::boundingRect((_InputArray *)local_230);
      local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11].x = local_230._0_4_;
      local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11].y = local_230._4_4_;
      local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11].width = local_230._8_4_;
      local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11].height = iStack_224;
      cv::Mat::~Mat((Mat *)local_4e0);
      lVar10 = *local_188 * (long)(int)uVar11;
      *(float *)((long)SStack_1c0 + lVar10) = (float)uVar11;
      *(float *)((long)SStack_1c0 + 4 + lVar10) =
           (float)local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11].height *
           (float)local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11].width;
      local_4d8 = (Mat *)(local_328.
                          super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar11);
      auStack_4d0._0_4_ = 0;
      auStack_4d0._4_4_ = 0;
      local_4e0._0_4_ = 0x8103000c;
      cv::minEnclosingCircle
                ((_InputArray *)local_4e0,
                 (Point_ *)
                 (local_2e0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start + uVar11),
                 local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar11);
      lVar10 = (long)(int)uVar11 * *local_a8;
      *(float *)((long)SStack_e0 + lVar10) = (float)uVar11;
      *(float *)((long)SStack_e0 + 4 + lVar10) =
           local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11] *
           local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11];
      local_2c8._8_8_ =
           local_328.
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + uVar11;
      local_2b8.width = 0;
      local_2b8.height = 0;
      local_2c8._0_4_ = -0x7efcfff4;
      cv::moments((_InputArray *)local_4e0,SUB81(local_2c8,0));
      pMVar4 = local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = uVar11 * 0xc0;
      memcpy(local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
             super__Vector_impl_data._M_start + lVar10,(_InputArray *)local_4e0,0xc0);
      dVar1 = *(double *)(pMVar4 + lVar10);
      dVar2 = *(double *)(pMVar4 + lVar10 + 0x10);
      local_2f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11].x = (float)(*(double *)(pMVar4 + lVar10 + 8) / dVar1)
      ;
      local_2f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11].y = (float)(dVar2 / dVar1);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  local_168[0] = *(ulong *)local_90.size.p << 0x20 | *(ulong *)local_90.size.p >> 0x20;
  cv::Mat::zeros(local_4e0,local_168,0x10);
  cv::Mat::Mat((Mat *)local_2c8);
  (**(code **)(*(long *)local_4e0 + 0x18))(local_4e0,local_4e0,(Mat *)local_2c8,0xffffffff);
  cv::Mat::~Mat(&local_410);
  cv::Mat::~Mat(&local_470);
  cv::Mat::~Mat((Mat *)auStack_4d0);
  local_170 = *(ulong *)local_90.size.p << 0x20 | *(ulong *)local_90.size.p >> 0x20;
  cv::Mat::zeros(local_4e0,&local_170,0x10);
  cv::Mat::Mat((Mat *)local_230);
  (**(code **)(*(long *)local_4e0 + 0x18))(local_4e0,local_4e0,(Mat *)local_230,0xffffffff);
  cv::Mat::~Mat(&local_410);
  cv::Mat::~Mat(&local_470);
  cv::Mat::~Mat((Mat *)auStack_4d0);
  if (local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_548.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_54c = 0;
  }
  else {
    lVar10 = 0;
    lVar13 = 0;
    lVar12 = 0;
    uVar11 = 0;
    local_54c = 0;
    do {
      uVar9 = (rng.state >> 0x20) + (rng.state & 0xffffffff) * 0xf83f630a;
      local_508._0_8_ = (BADTYPE)((int)((uVar9 & 0xffffffff) / 0xff) * -0xff + (int)uVar9);
      uVar9 = (uVar9 >> 0x20) + (uVar9 & 0xffffffff) * 0xf83f630a;
      rng.state = (uVar9 >> 0x20) + (uVar9 & 0xffffffff) * 0xf83f630a;
      local_508.obj = (void *)(double)((int)((uVar9 & 0xffffffff) / 0xff) * -0xff + (int)uVar9);
      local_508.sz = (Size)(double)((int)((rng.state & 0xffffffff) / 0xff) * -0xff + (int)rng.state)
      ;
      uStack_4f0 = 0;
      if (1500.0 < *(float *)((long)SStack_1c0 + 4 + (lVar10 >> 0x20) * *local_188)) {
        auStack_4d0._0_4_ = 0;
        auStack_4d0._4_4_ = 0;
        local_4e0._0_4_ = 0x3010000;
        local_4d8 = (Mat *)local_2c8;
        local_360 = *(int *)((long)&(local_380.
                                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->x + lVar12);
        local_35c = *(int *)((long)&(local_380.
                                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->y + lVar12);
        local_368 = local_360 +
                    *(int *)((long)&(local_380.
                                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->width + lVar12);
        local_364 = local_35c +
                    *(int *)((long)&(local_380.
                                     super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->height + lVar12);
        cv::rectangle((Mat *)local_4e0,&local_360,&local_368,&local_508,2,8,0);
        cv::Mat::Mat((Mat *)local_4e0,&src,
                     (Rect_ *)((long)&(local_380.
                                       super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->x + lVar12));
        cv::Mat::operator=((Mat *)((long)&((Mat *)(&((Mat *)(&((Mat *)(&(local_248.
                                                                                                                                                  
                                                  super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->step +
                                                  -3))->step + -3))->step + -3))->step +
                                  lVar13 + 0xffffffffffffffb8U),(Mat *)local_4e0);
        cv::Mat::~Mat((Mat *)local_4e0);
        sVar6 = strlen(local_4e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DAT_00108328,local_4e8,sVar6)
        ;
        poVar7 = std::ostream::_M_insert<unsigned_long>(0x108328);
        sVar6 = strlen(local_530);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_530,sVar6);
        std::__cxx11::stringbuf::str();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_4e0,(long)local_4d8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (local_4e0 != (undefined1  [8])auStack_4d0) {
          operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
        }
        std::ios::clear((int)*(undefined8 *)(thresh_callback(int,void*)::oss_abi_cxx11_ + -0x18) +
                        0x108318);
        local_4e0 = (undefined1  [8])auStack_4d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"");
        std::__cxx11::stringbuf::str((string *)&DAT_00108330);
        if (local_4e0 != (undefined1  [8])auStack_4d0) {
          operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
        }
        local_54c = local_54c + 1;
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
      lVar13 = lVar13 + 0x60;
      lVar10 = lVar10 + 0x100000000;
    } while (uVar11 < (ulong)(((long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_548.
                                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  printf("count %d\n",(ulong)local_54c);
  local_4e0 = (undefined1  [8])auStack_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"Contours","");
  cv::namedWindow((string *)local_4e0,1);
  if (local_4e0 != (undefined1  [8])auStack_4d0) {
    operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
  }
  local_4e0 = (undefined1  [8])auStack_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"contours_.jpg","");
  local_508.sz.width = 0;
  local_508.sz.height = 0;
  local_508.flags = 0x1010000;
  local_508.obj = local_2c8;
  local_528.super__InputArray.sz.width = 0;
  local_528.super__InputArray.sz.height = 0;
  local_528.super__InputArray._0_8_ = (void *)0x0;
  local_528.super__InputArray.obj = (void *)0x0;
  cv::imwrite((string *)local_4e0,&local_508,(vector *)&local_528);
  if ((void *)local_528.super__InputArray._0_8_ != (void *)0x0) {
    operator_delete((void *)local_528.super__InputArray._0_8_,
                    (long)local_528.super__InputArray.sz - local_528.super__InputArray._0_8_);
  }
  if (local_4e0 != (undefined1  [8])auStack_4d0) {
    operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
  }
  auStack_4d0._0_4_ = 0;
  auStack_4d0._4_4_ = 0;
  local_4e0._0_4_ = 0x1010000;
  local_4d8 = &src;
  local_508.sz.width = 0;
  local_508.sz.height = 0;
  local_508.flags = 0x1010000;
  local_508.obj = local_2c8;
  local_528.super__InputArray.sz.width = 0;
  local_528.super__InputArray.sz.height = 0;
  local_528.super__InputArray.flags = 0x2010000;
  local_528.super__InputArray.obj = local_230;
  p_Var8 = (_InputArray *)cv::noArray();
  cv::add((_InputArray *)local_4e0,&local_508,&local_528,p_Var8,-1);
  local_4e0 = (undefined1  [8])auStack_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"Contours","");
  local_508.sz.width = 0;
  local_508.sz.height = 0;
  local_508.flags = 0x1010000;
  local_508.obj = local_230;
  cv::imshow((string *)local_4e0,&local_508);
  if (local_4e0 != (undefined1  [8])auStack_4d0) {
    operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
  }
  local_4e0 = (undefined1  [8])auStack_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4e0,"overlap.jpg","");
  local_508.sz.width = 0;
  local_508.sz.height = 0;
  local_508.flags = 0x1010000;
  local_528.super__InputArray.sz.width = 0;
  local_528.super__InputArray.sz.height = 0;
  local_528.super__InputArray._0_8_ = (void *)0x0;
  local_528.super__InputArray.obj = (void *)0x0;
  local_508.obj = local_230;
  cv::imwrite((string *)local_4e0,&local_508,(vector *)&local_528);
  if ((void *)local_528.super__InputArray._0_8_ != (void *)0x0) {
    operator_delete((void *)local_528.super__InputArray._0_8_,
                    (long)local_528.super__InputArray.sz - local_528.super__InputArray._0_8_);
  }
  if (local_4e0 != (undefined1  [8])auStack_4d0) {
    operator_delete((void *)local_4e0,(long)auStack_4d0 + 1);
  }
  cv::Mat::~Mat((Mat *)local_230);
  cv::Mat::~Mat((Mat *)local_2c8);
  cv::Mat::~Mat((Mat *)local_f0);
  cv::Mat::~Mat((Mat *)local_158);
  cv::Mat::~Mat((Mat *)local_1d0);
  if (local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_310.super__Vector_base<cv::Moments,_std::allocator<cv::Moments>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_248);
  if (local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f8.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f8.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.
                          super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_380.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_380.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_380.
                          super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_328);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_268);
  if (local_358 != (void *)0x0) {
    operator_delete(local_358,local_348 - (long)local_358);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_548);
  cv::Mat::~Mat(&local_90);
  return;
}

Assistant:

void thresh_callback(int, void* )
{
  Mat threshold_output;
  vector<vector<Point> > contours;
  vector<Vec4i> hierarchy;
  vector<Mat> contourRegion;
  float minArea= 1500.0;  // threshold for area-wise cleanup
  /// Detect edges using Threshold for user thresh i/p
// threshold( src_gray, threshold_output, thresh, 255, THRESH_BINARY );
	//adaptiveThreshold(src_gray, threshold_output, 255, ADAPTIVE_THRESH_GAUSSIAN_C, CV_THRESH_BINARY, 151, 0);
 // threshold( src_gray, threshold_output, 128, 255, THRESH_BINARY );
  inRange(src_gray, 10,100, threshold_output);
  imshow("thresh", threshold_output);
  imwrite("middle.jpg", threshold_output);
  //closing operation
//  dilate(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  erode(threshold_output, threshold_output, cv::Mat(), cv::Point(-1,-1),3);
//  imshow("thresh_close", threshold_output);
  
  /// Find contours
  findContours( threshold_output, contours, hierarchy, RETR_TREE, CHAIN_APPROX_SIMPLE, Point(0, 0) );
  
  //variables for drawing and extraction
  vector<vector<Point> > contours_poly( contours.size() );
  vector<Rect> boundRect( contours.size() );
  vector<Point2f>center( contours.size() );	 // centers of the enclosing circles
  vector<Point2f>center_contours( contours.size() );	 // centers of the contours
  vector<float>radius( contours.size() );  //radii of the enclosing circles
  vector<Mat>images(contours.size()); // extracted images from bounding rectangles
  vector<Moments>mu(contours.size()); // moments of the contours
 
  Mat area = Mat::zeros(contours.size(), 2, CV_32F);
  Mat cropped;
  Mat area1 = Mat::zeros(contours.size(), 2, CV_32F);
  static std:: stringstream oss;
  int count_contours =0;  // contours with area greater than minArea 
  char destname[30]= "";
  const char  str1[7] = "result";
  const char str2[5] = ".jpg";
  
  /// Approximate contours to polygons + get bounding rects and circles
  for( size_t i = 0; i < contours.size(); i++ )
     { 
		approxPolyDP( Mat(contours[i]), contours_poly[i], 3, true );
        boundRect[i] = boundingRect( Mat(contours_poly[i]) );
	    // area of rectangles
	     area.at<float>(i,0)=(float)i;
		 area.at<float>(i,1)= (float)boundRect[i].width* boundRect[i].height;
		
         minEnclosingCircle( contours_poly[i], center[i], radius[i] );
		// area of circles
	     area1.at<float>(i,0)=(float)i;
		 area1.at<float>(i,1)= (float)(radius[i]*radius[i]);

		//moments of the contour
		mu[i]= moments(contours_poly[i], false);
		
		//center of the contour
		center_contours[i]= Point2f( mu[i].m10/mu[i].m00 , mu[i].m01/mu[i].m00 );
     }


  /// Draw polygonal contour + bonding rects + circles
	  Mat drawing = Mat::zeros( threshold_output.size(), CV_8UC3 );
	  Mat overlap = Mat::zeros( threshold_output.size(), CV_8UC3 );
  for( size_t i = 0; i< contours.size(); i++ )
     {
       Scalar color = Scalar( rng.uniform(0, 255), rng.uniform(0,255), rng.uniform(0,255) );
       //drawContours( drawing, contours_poly, (int)i, color, 1, 8, vector<Vec4i>(), 0, Point() );
//  try if something else can be used for comparison  e.g contourArea/RectArea
       if(area.at<float>(i,1)> minArea)
		{	
			 //draw the rectangle
			  rectangle( drawing, boundRect[i].tl(), boundRect[i].br(), color, 2, 8, 0 );
			 //calculate moments for the contour
			 // draw the enclosing circle
             // circle( drawing, center[i], (int)radius[i], color, 2, 8, 0 );
			 
			 //mark the center of the contour
			 //circle(drawing,center_contours[i],3, Scalar(255,0,0), -1,8,0 );
			  
			  images[i]= src(boundRect[i]);
			  count_contours +=1;
			  //mark the center of the enclosing circle
			  //circle( drawing, center[i], 3, Scalar(0,255,0), -1, 8, 0 );

			//  strcpy(destname, str1); itoa((int)i, destname, 10);
			//	strcat(destname, str2);
			oss<< str1 << i<< str2;
	        cout << oss.str() << endl;
				 
			 // imshow(oss.str(), images[i]);
			  oss.clear();
			  oss.str(""); 
		}
	
			   
     }
/*	for(size_t i=0;i <contours.size();i++)
	{		
			Mat mask = Mat::zeros(src.size(), CV_8UC1);
			drawContours(mask, contours, (int)i, Scalar(255), CV_FILLED);		
			Mat imageROI;
			src.copyTo(imageROI, mask);
			contourRegion[i]= imageROI(boundRect[i]);
	}*/
		
//printing areas of rectangles
/*	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}

//	qsort(area.data, area.rows, sizeof(area.row(0)), compareforsort);
	
	for(size_t i=0;i<contours.size(); i++)
	{
			cout<< " " << area.at<float>(i,0) <<  " " << area.at<float>(i,1) << endl;
	}*/
	printf("count %d\n", count_contours);
  /// Show in a window
  namedWindow( "Contours" );
  //imshow( "Contours", drawing );
	imwrite("contours_.jpg", drawing);
	
	add(src, drawing, overlap);
	imshow("Contours", overlap);
	imwrite("overlap.jpg", overlap);
}